

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O0

void __thiscall MingwMakefileGenerator::writeIncPart(MingwMakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QMakeProject *t_00;
  const_iterator baseName;
  const_iterator objList;
  QTextStream *this_00;
  QStringBuilder<char,_const_QString_&> *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char,_const_QString_&> QVar4;
  ProString *incit;
  add_const_t<const_ProStringList> *__range1;
  int totalLength;
  ProStringList *incs;
  QString inc;
  const_iterator __end1;
  const_iterator __begin1;
  QString fileName;
  QChar sep;
  QTextStream responseStream;
  QFile responseFile;
  undefined4 in_stack_fffffffffffffde8;
  PatternOption in_stack_fffffffffffffdec;
  QMakeProject *in_stack_fffffffffffffdf0;
  QStringBuilder<char,_const_QString_&> *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  ProKey *v;
  QMakeProject *this_01;
  undefined4 in_stack_fffffffffffffe40;
  uint uVar5;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe58;
  int iVar6;
  undefined1 local_180 [28];
  QChar local_164;
  QChar local_162 [15];
  uint local_144;
  undefined1 local_140 [24];
  QRegularExpression local_128 [8];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  ProString *local_108;
  const_iterator local_100;
  const_iterator local_f8;
  undefined1 local_e9;
  char local_e8;
  QString *local_e0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  QChar local_5a;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<((QTextStream *)in_RSI,"INCPATH       = ");
  v = (ProKey *)in_RDI[0x1b];
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffdf0,
                 (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  t_00 = (QMakeProject *)
         QMakeProject::values
                   (in_stack_fffffffffffffdf0,
                    (ProKey *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  ProKey::~ProKey((ProKey *)0x235365);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_40 = 0xaaaaaaaaaaaaaaaa;
  this_01 = t_00;
  QFile::QFile((QFile *)&local_48);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_58);
  local_5a.ucs = L'ꪪ';
  QChar::QChar<char,_true>(&local_5a,' ');
  baseName = QList<ProString>::constBegin((QList<ProString> *)in_stack_fffffffffffffdf0);
  objList = QList<ProString>::constEnd((QList<ProString> *)in_stack_fffffffffffffdf0);
  iVar2 = std::
          accumulate<QList<ProString>::const_iterator,int,MingwMakefileGenerator::writeIncPart(QTextStream&)::__0>
                    (baseName.i,objList.i,0);
  iVar6 = iVar2;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffdf0,
                 (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  iVar3 = QMakeProject::intValue(this_01,v,iVar3);
  ProKey::~ProKey((ProKey *)0x235470);
  if (iVar3 < iVar2) {
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_fffffffffffffdf8,(char *)CONCAT44(iVar2,iVar3));
    QString::QString((QString *)in_stack_fffffffffffffdf8,(char *)CONCAT44(iVar2,iVar3));
    MakefileGenerator::createResponseFile
              ((MakefileGenerator *)CONCAT44(iVar6,in_stack_fffffffffffffe58),
               &(baseName.i)->m_string,(ProStringList *)objList.i,
               (QString *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    QString::~QString((QString *)0x235513);
    QString::~QString((QString *)0x235520);
    bVar1 = QString::isEmpty((QString *)0x23552d);
    if (!bVar1) {
      local_e9 = 0x40;
      in_stack_fffffffffffffdf8 = in_RSI;
      QVar4 = ::operator+((char *)in_stack_fffffffffffffdf0,
                          (QString *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      local_e0 = QVar4.b;
      local_e8 = QVar4.a;
      ::operator<<((QTextStream *)t_00,in_stack_fffffffffffffdf8);
      ::operator<<((QTextStream *)in_stack_fffffffffffffdf0,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    }
    uVar5 = (uint)!bVar1;
    QString::~QString((QString *)0x2355af);
    if (uVar5 != 0) goto LAB_00235836;
  }
  local_f8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_f8 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffdf0);
  local_100.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_100 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffdf0);
  while( true ) {
    local_108 = local_100.i;
    bVar1 = QList<ProString>::const_iterator::operator!=(&local_f8,local_100);
    if (!bVar1) break;
    QList<ProString>::const_iterator::operator*(&local_f8);
    local_120 = 0xaaaaaaaaaaaaaaaa;
    local_118 = 0xaaaaaaaaaaaaaaaa;
    local_110 = 0xaaaaaaaaaaaaaaaa;
    ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
    ;
    QString::QString((QString *)in_stack_fffffffffffffdf8,(char *)CONCAT44(iVar2,iVar3));
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffdec);
    QRegularExpression::QRegularExpression
              (local_128,(QString *)local_140,(QFlags_conflict *)(ulong)local_144);
    QString::QString((QString *)in_stack_fffffffffffffdf8,(char *)CONCAT44(iVar2,iVar3));
    QString::replace((QRegularExpression *)&local_120,(QString *)local_128);
    QString::~QString((QString *)0x235725);
    QRegularExpression::~QRegularExpression(local_128);
    QString::~QString((QString *)0x23573f);
    QChar::QChar<char,_true>(local_162,'\\');
    QChar::QChar<char,_true>(&local_164,'/');
    QString::replace((QChar)(char16_t)&local_120,local_162[0],(uint)(ushort)local_164.ucs);
    in_stack_fffffffffffffdf0 = (QMakeProject *)QTextStream::operator<<((QTextStream *)in_RSI,"-I");
    (**(code **)(*in_RDI + 0x60))(local_180,in_RDI,&local_120);
    this_00 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffdf0,(QString *)local_180)
    ;
    QTextStream::operator<<(this_00,local_5a);
    QString::~QString((QString *)0x2357fb);
    QString::~QString((QString *)0x235808);
    QList<ProString>::const_iterator::operator++(&local_f8);
  }
  ::operator<<((QTextStream *)in_stack_fffffffffffffdf0,
               (QTextStreamFunction)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
LAB_00235836:
  QTextStream::~QTextStream((QTextStream *)&local_58);
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MingwMakefileGenerator::writeIncPart(QTextStream &t)
{
    t << "INCPATH       = ";

    const ProStringList &incs = project->values("INCLUDEPATH");
    QFile responseFile;
    QTextStream responseStream;
    QChar sep(' ');
    int totalLength = std::accumulate(incs.constBegin(), incs.constEnd(), 0,
                                      [](int total, const ProString &inc) {
        return total + inc.size() + 2;
    });
    if (totalLength > project->intValue("QMAKE_RESPONSEFILE_THRESHOLD", 8000)) {
        const QString fileName = createResponseFile("incpath", incs, "-I");
        if (!fileName.isEmpty()) {
            t << '@' + fileName;
            t << Qt::endl;
            return;
        }
    }
    for (const ProString &incit: std::as_const(incs)) {
        QString inc = incit.toQString();
        inc.replace(QRegularExpression("\\\\$"), "");
        inc.replace('\\', '/');
        t << "-I" << escapeFilePath(inc) << sep;
    }
    t << Qt::endl;
}